

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksplitter.c
# Opt level: O2

void ZopfliBlockSplit(ZopfliOptions *options,uchar *in,size_t instart,size_t inend,size_t maxblocks,
                     size_t **splitpoints,size_t *npoints)

{
  size_t sVar1;
  size_t sVar2;
  size_t *__ptr;
  size_t *psVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  size_t nlz77points;
  size_t *lz77splitpoints;
  ZopfliLZ77Store store;
  ZopfliBlockState s;
  ZopfliHash hash;
  
  lz77splitpoints = (size_t *)0x0;
  nlz77points = 0;
  ZopfliInitLZ77Store(in,&store);
  ZopfliInitBlockState(options,instart,inend,0,&s);
  ZopfliAllocHash(0x8000,&hash);
  *npoints = 0;
  *splitpoints = (size_t *)0x0;
  ZopfliLZ77Greedy(&s,in,instart,inend,&store,&hash);
  ZopfliBlockSplitLZ77(options,&store,maxblocks,&lz77splitpoints,&nlz77points);
  __ptr = lz77splitpoints;
  sVar2 = nlz77points;
  if (nlz77points != 0) {
    for (uVar6 = 0; uVar4 = 1, uVar6 < store.size; uVar6 = uVar6 + 1) {
      if (store.dists[uVar6] != 0) {
        uVar4 = (ulong)store.litlens[uVar6];
      }
      uVar5 = *npoints;
      if (uVar6 == __ptr[uVar5]) {
        if ((uVar5 & uVar5 - 1) == 0) {
          if (uVar5 == 0) {
            psVar3 = (size_t *)malloc(8);
            uVar5 = 0;
          }
          else {
            psVar3 = (size_t *)realloc(*splitpoints,uVar5 << 4);
            uVar5 = *npoints;
          }
          *splitpoints = psVar3;
        }
        else {
          psVar3 = *splitpoints;
        }
        psVar3[uVar5] = instart;
        sVar1 = *npoints;
        *npoints = sVar1 + 1;
        if (sVar1 + 1 == sVar2) break;
      }
      instart = instart + uVar4;
    }
  }
  free(__ptr);
  ZopfliCleanBlockState(&s);
  ZopfliCleanLZ77Store(&store);
  ZopfliCleanHash(&hash);
  return;
}

Assistant:

void ZopfliBlockSplit(const ZopfliOptions* options,
                      const unsigned char* in, size_t instart, size_t inend,
                      size_t maxblocks, size_t** splitpoints, size_t* npoints) {
  size_t pos = 0;
  size_t i;
  ZopfliBlockState s;
  size_t* lz77splitpoints = 0;
  size_t nlz77points = 0;
  ZopfliLZ77Store store;
  ZopfliHash hash;
  ZopfliHash* h = &hash;

  ZopfliInitLZ77Store(in, &store);
  ZopfliInitBlockState(options, instart, inend, 0, &s);
  ZopfliAllocHash(ZOPFLI_WINDOW_SIZE, h);

  *npoints = 0;
  *splitpoints = 0;

  /* Unintuitively, Using a simple LZ77 method here instead of ZopfliLZ77Optimal
  results in better blocks. */
  ZopfliLZ77Greedy(&s, in, instart, inend, &store, h);

  ZopfliBlockSplitLZ77(options,
                       &store, maxblocks,
                       &lz77splitpoints, &nlz77points);

  /* Convert LZ77 positions to positions in the uncompressed input. */
  pos = instart;
  if (nlz77points > 0) {
    for (i = 0; i < store.size; i++) {
      size_t length = store.dists[i] == 0 ? 1 : store.litlens[i];
      if (lz77splitpoints[*npoints] == i) {
        ZOPFLI_APPEND_DATA(pos, splitpoints, npoints);
        if (*npoints == nlz77points) break;
      }
      pos += length;
    }
  }
  assert(*npoints == nlz77points);

  free(lz77splitpoints);
  ZopfliCleanBlockState(&s);
  ZopfliCleanLZ77Store(&store);
  ZopfliCleanHash(h);
}